

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<long_long,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<long_long,void> *this,longlong value)

{
  ReusableStringStream *pRVar1;
  char local_35 [13];
  undefined1 local_28 [8];
  ReusableStringStream rss;
  longlong value_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_28);
  ReusableStringStream::operator<<((ReusableStringStream *)local_28,(longlong *)&rss.m_oss);
  if (0xff < (long)rss.m_oss) {
    pRVar1 = ReusableStringStream::operator<<((ReusableStringStream *)local_28,(char (*) [5])" (0x")
    ;
    pRVar1 = ReusableStringStream::operator<<(pRVar1,std::hex);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(longlong *)&rss.m_oss);
    local_35[0] = ')';
    ReusableStringStream::operator<<(pRVar1,local_35);
  }
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_28);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<long long>::convert(long long value) {
        ReusableStringStream rss;
        rss << value;
        if (value > Detail::hexThreshold) {
            rss << " (0x" << std::hex << value << ')';
        }
        return rss.str();
    }